

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O3

void __thiscall embree::XMLWriter::store(XMLWriter *this,char *name,AffineSpace3fa *space)

{
  undefined1 *puVar1;
  char cVar2;
  size_t sVar3;
  ostream *poVar4;
  ulong uVar5;
  
  if (this->ident != 0) {
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->ident);
  }
  puVar1 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"<",1);
  if (name == (char *)0x0) {
    std::ios::clear((int)puVar1 + (int)*(undefined8 *)(*(long *)puVar1 + -0x18));
  }
  else {
    sVar3 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,name,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,">",1);
  cVar2 = (char)puVar1;
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if (this->ident != 0) {
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," ",1);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->ident);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"  ",2);
  poVar4 = std::ostream::_M_insert<double>((double)(space->l).vx.field_0.m128[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::ostream::_M_insert<double>((double)(space->l).vy.field_0.m128[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::ostream::_M_insert<double>((double)(space->l).vz.field_0.m128[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::ostream::_M_insert<double>((double)(space->p).field_0.m128[0]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (this->ident != 0) {
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," ",1);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->ident);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"  ",2);
  poVar4 = std::ostream::_M_insert<double>((double)(space->l).vx.field_0.m128[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::ostream::_M_insert<double>((double)(space->l).vy.field_0.m128[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::ostream::_M_insert<double>((double)(space->l).vz.field_0.m128[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::ostream::_M_insert<double>((double)(space->p).field_0.m128[1]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (this->ident != 0) {
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," ",1);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->ident);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"  ",2);
  poVar4 = std::ostream::_M_insert<double>((double)(space->l).vx.field_0.m128[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::ostream::_M_insert<double>((double)(space->l).vy.field_0.m128[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::ostream::_M_insert<double>((double)(space->l).vz.field_0.m128[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::ostream::_M_insert<double>((double)(space->p).field_0.m128[2]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (this->ident != 0) {
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," ",1);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->ident);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"</",2);
  if (name == (char *)0x0) {
    std::ios::clear((int)puVar1 + (int)*(undefined8 *)(*(long *)puVar1 + -0x18));
  }
  else {
    sVar3 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,name,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,">",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)puVar1 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void XMLWriter::store(const char* name, const AffineSpace3fa& space)
  {
    tab(); xml << "<" << name << ">" << std::endl;
    tab(); xml << "  " << space.l.vx.x << " " << space.l.vy.x << " " << space.l.vz.x << " " << space.p.x << std::endl;
    tab(); xml << "  " << space.l.vx.y << " " << space.l.vy.y << " " << space.l.vz.y << " " << space.p.y << std::endl;
    tab(); xml << "  " << space.l.vx.z << " " << space.l.vy.z << " " << space.l.vz.z << " " << space.p.z << std::endl;
    tab(); xml << "</" << name << ">" << std::endl;
  }